

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkReadNodeNames(Abc_Ntk_t *pNtk,char *pFileName)

{
  FILE *__stream;
  Vec_Ptr_t *__ptr;
  void **ppvVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char Buffer [1000];
  char local_418 [1000];
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (Vec_Ptr_t *)0x0;
    printf("Cannot open node list \"%s\".\n",pFileName);
  }
  else {
    __ptr = (Vec_Ptr_t *)malloc(0x10);
    __ptr->nCap = 100;
    __ptr->nSize = 0;
    ppvVar1 = (void **)malloc(800);
    __ptr->pArray = ppvVar1;
    pcVar2 = fgets(local_418,1000,__stream);
    if (pcVar2 != (char *)0x0) {
      lVar4 = 0;
      uVar6 = 100;
      do {
        pcVar2 = strtok(local_418," \n\r\t");
        if (pcVar2 != (char *)0x0) {
          lVar7 = (long)(int)lVar4;
          do {
            pAVar3 = Abc_NtkFindNode(pNtk,pcVar2);
            if (pAVar3 == (Abc_Obj_t *)0x0) {
              printf("Cannot find node \"%s\".\n",pcVar2);
              if (__ptr->pArray != (void **)0x0) {
                free(__ptr->pArray);
              }
              free(__ptr);
              fclose(__stream);
              return (Vec_Ptr_t *)0x0;
            }
            iVar5 = (int)uVar6;
            if ((int)lVar7 == iVar5) {
              if (iVar5 < 0x10) {
                if (__ptr->pArray == (void **)0x0) {
                  ppvVar1 = (void **)malloc(0x80);
                }
                else {
                  ppvVar1 = (void **)realloc(__ptr->pArray,0x80);
                }
                __ptr->pArray = ppvVar1;
                __ptr->nCap = 0x10;
                uVar6 = 0x10;
              }
              else {
                uVar6 = (ulong)(uint)(iVar5 * 2);
                if (__ptr->pArray == (void **)0x0) {
                  ppvVar1 = (void **)malloc(uVar6 * 8);
                }
                else {
                  ppvVar1 = (void **)realloc(__ptr->pArray,uVar6 * 8);
                }
                __ptr->pArray = ppvVar1;
                __ptr->nCap = iVar5 * 2;
              }
            }
            else {
              ppvVar1 = __ptr->pArray;
            }
            lVar4 = lVar7 + 1;
            __ptr->nSize = (int)lVar4;
            ppvVar1[lVar7] = pAVar3;
            pcVar2 = strtok((char *)0x0," \n\r\t");
            lVar7 = lVar4;
          } while (pcVar2 != (char *)0x0);
        }
        pcVar2 = fgets(local_418,1000,__stream);
      } while (pcVar2 != (char *)0x0);
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Abc_NtkReadNodeNames( Abc_Ntk_t * pNtk, char * pFileName )
{
    char Buffer[1000];
    Vec_Ptr_t * vNodes = NULL;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open node list \"%s\".\n", pFileName );
        return NULL;
    }
    vNodes = Vec_PtrAlloc( 100 );
    while ( fgets(Buffer, 1000, pFile) != NULL ) 
    {
        char * pToken = strtok( Buffer, " \n\r\t" );
        while ( pToken )
        {
            Abc_Obj_t * pObj = Abc_NtkFindNode( pNtk, pToken );
            if ( pObj == NULL )
            {
                printf( "Cannot find node \"%s\".\n", pToken );
                Vec_PtrFree( vNodes );
                fclose( pFile );
                return NULL;
            }
            Vec_PtrPush( vNodes, pObj );
            pToken = strtok( NULL, " \n\r\t" );
        }
    }
    fclose( pFile );
    return vNodes;
}